

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::convertCase_pcp<axl::enc::ToUpperCase>
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this)

{
  C *dst;
  C *pCVar1;
  C *p;
  size_t length;
  StringRef src;
  StringRef *in_stack_ffffffffffffff58;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this_00;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff60;
  SrcUnit *in_stack_ffffffffffffff68;
  SrcUnit *in_stack_ffffffffffffff70;
  SrcUnit *in_stack_ffffffffffffff78;
  C *in_stack_ffffffffffffffd0;
  BufHdr *in_stack_ffffffffffffffd8;
  size_t local_8;
  utf32_t replacement;
  
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_8 = enc::
            Convert<axl::enc::Utf8,_axl::enc::Utf8,_axl::enc::ToUpperCase,_axl::enc::Utf8Decoder>::
            calcRequiredLength(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                               (utf32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  dst = createBuffer((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                     in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0,
                     SUB81(local_8 >> 0x38,0));
  if (dst == (C *)0x0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    this_00 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)&stack0xffffffffffffffd0;
    pCVar1 = StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cp(this_00);
    replacement = (utf32_t)((ulong)pCVar1 >> 0x20);
    StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getEnd(this_00);
    enc::Convert<axl::enc::Utf8,_axl::enc::Utf8,_axl::enc::ToUpperCase,_axl::enc::Utf8Decoder>::
    convert_u(dst,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,replacement);
  }
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x13555f);
  return local_8;
}

Assistant:

size_t
	convertCase_pcp() {
		StringRef src = *this; // save old contents -- can't convert in-place because length can increase

		size_t length = enc::Convert<Encoding, Encoding, CaseOp>::calcRequiredLength(this->m_p, this->m_p + this->m_length);
		C* p = createBuffer(length);
		if (!p)
			return -1;

		enc::Convert<Encoding, Encoding, CaseOp>::convert_u(p, src.cp(), src.getEnd());
		return length;
	}